

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OplsTorsionType.hpp
# Opt level: O2

void __thiscall
OpenMD::OplsTorsionType::OplsTorsionType
          (OplsTorsionType *this,RealType v1,RealType v2,RealType v3,bool trans180)

{
  _Rb_tree_header *p_Var1;
  undefined7 in_register_00000031;
  RealType coefficient;
  RealType coefficient_00;
  
  p_Var1 = &(this->super_PolynomialTorsionType).polynomial_.polyPairMap_._M_t._M_impl.
            super__Rb_tree_header;
  (this->super_PolynomialTorsionType).polynomial_.polyPairMap_._M_t._M_impl.super__Rb_tree_header.
  _M_header._M_color = _S_red;
  *(_Base_ptr *)
   ((long)&(this->super_PolynomialTorsionType).polynomial_.polyPairMap_._M_t._M_impl.
           super__Rb_tree_header._M_header + 8) = (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->super_PolynomialTorsionType).polynomial_.polyPairMap_._M_t._M_impl.
           super__Rb_tree_header._M_header + 0x10) = p_Var1;
  *(_Rb_tree_header **)
   ((long)&(this->super_PolynomialTorsionType).polynomial_.polyPairMap_._M_t._M_impl.
           super__Rb_tree_header._M_header + 0x18) = p_Var1;
  (this->super_PolynomialTorsionType).polynomial_.polyPairMap_._M_t._M_impl.super__Rb_tree_header.
  _M_node_count = 0;
  (this->super_PolynomialTorsionType).super_TorsionType._vptr_TorsionType =
       (_func_int **)&PTR__PolynomialTorsionType_002c2a90;
  this->v1_ = v1;
  this->v2_ = v2;
  this->v3_ = v3;
  coefficient_00 = v3 + v3;
  if ((int)CONCAT71(in_register_00000031,trans180) == 0) {
    coefficient_00 = -coefficient_00;
  }
  PolynomialTorsionType::setCoefficient(&this->super_PolynomialTorsionType,0,(v1 + v3) * 0.5 + v2);
  coefficient = (v3 * -3.0 + v1) * 0.5;
  if (!trans180) {
    coefficient = -coefficient;
  }
  PolynomialTorsionType::setCoefficient(&this->super_PolynomialTorsionType,1,coefficient);
  PolynomialTorsionType::setCoefficient(&this->super_PolynomialTorsionType,2,-v2);
  PolynomialTorsionType::setCoefficient(&this->super_PolynomialTorsionType,3,coefficient_00);
  return;
}

Assistant:

OplsTorsionType(RealType v1, RealType v2, RealType v3, bool trans180) :
        PolynomialTorsionType(), v1_(v1), v2_(v2), v3_(v3) {
      // convert OPLS Torsion Type to Polynomial Torsion type
      RealType c0 = v2 + 0.5 * (v1 + v3);
      RealType c1 = 0.5 * (v1 - 3.0 * v3);
      RealType c2 = -v2;
      RealType c3 = 2.0 * v3;

      if (!trans180) {
        c1 = -c1;
        c3 = -c3;
      }

      setCoefficient(0, c0);
      setCoefficient(1, c1);
      setCoefficient(2, c2);
      setCoefficient(3, c3);
    }